

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool line_comment_herald(Env *env)

{
  _Bool _Var1;
  _Bool local_11;
  Env *env_local;
  
  _Var1 = seq(env,"--");
  local_11 = false;
  if (_Var1) {
    local_11 = only_minus(env);
  }
  return local_11;
}

Assistant:

static bool line_comment_herald(Env *env) {
  return seq(env, "--") && only_minus(env);
}